

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_TextureMapping::HasMatchingCachedTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_Xform *mesh_xform)

{
  ON_TextureCoordinates *pOVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if ((mesh->m_TC).m_count < 1) {
    return false;
  }
  lVar4 = 0;
  lVar5 = 0;
  while( true ) {
    iVar3 = ON_Mesh::VertexCount(mesh);
    pOVar1 = (mesh->m_TC).m_a;
    if ((iVar3 == *(int *)((long)&(pOVar1->m_T).m_count + lVar4)) &&
       (bVar2 = HasMatchingTextureCoordinates
                          (this,(ON_MappingTag *)((pOVar1->m_tag).m_mapping_id.Data4 + lVar4 + -8),
                           mesh_xform), bVar2)) break;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0xb8;
    if ((mesh->m_TC).m_count <= lVar5) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ON_TextureMapping::HasMatchingCachedTextureCoordinates(
  const ON_Mesh& mesh,
  const ON_Xform* mesh_xform
) const
{
  bool rc = false;

  for (int i = 0; i < mesh.m_TC.Count(); i++)
  {
    if (mesh.VertexCount() == mesh.m_TC[i].m_T.Count() && HasMatchingTextureCoordinates(mesh.m_TC[i].m_tag, mesh_xform))
    {
      rc = true;
      break;
    }
  }

  return rc;
}